

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
anon_unknown.dwarf_126757b::TargetSourcesImpl::ConvertToAbsoluteContent
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,TargetSourcesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,IsInterface isInterfaceContent,CheckCMP0076 checkCmp0076)

{
  pointer pbVar1;
  TargetSourcesImpl *pTVar2;
  bool bVar3;
  __type _Var4;
  PolicyStatus PVar5;
  size_type sVar6;
  string *psVar7;
  cmMakefile *pcVar8;
  string *__rhs;
  undefined8 uVar9;
  ostream *poVar10;
  PolicyID id;
  pointer in_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char local_219;
  uint local_218;
  IsInterface local_214;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_210;
  cmTarget *local_208;
  TargetSourcesImpl *local_200;
  CheckCMP0076 local_1f4;
  string local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absoluteContent;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  local_214 = isInterfaceContent;
  local_208 = tgt;
  if ((checkCmp0076 == Yes) &&
     (PVar5 = cmMakefile::GetPolicyStatus
                        ((this->super_cmTargetPropCommandBase).Makefile,CMP0076,false), PVar5 == OLD
     )) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
    return __return_storage_ptr__;
  }
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200 = this;
  local_1f4 = checkCmp0076;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&absoluteContent,
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  in_name = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_218 = 0;
  local_210 = content;
  local_1d0 = __return_storage_ptr__;
  for (; this_00 = local_1d0, in_name != pbVar1; in_name = in_name + 1) {
    _e = (pointer)local_198;
    local_198[0]._M_local_buf[0] = '\0';
    bVar3 = cmsys::SystemTools::FileIsFullPath(in_name);
    if ((bVar3) || (sVar6 = cmGeneratorExpression::Find(in_name), sVar6 == 0)) {
LAB_0039584c:
      std::__cxx11::string::_M_assign((string *)&e);
    }
    else {
      if (local_214 == No) {
        psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                           ((local_200->super_cmTargetPropCommandBase).Makefile);
        pcVar8 = cmTarget::GetMakefile(local_208);
        __rhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar8);
        _Var4 = std::operator==(psVar7,__rhs);
        if (_Var4) goto LAB_0039584c;
      }
      psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                         ((local_200->super_cmTargetPropCommandBase).Makefile);
      local_219 = '/';
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&local_1f0,psVar7,&local_219,in_name);
      std::__cxx11::string::operator=((string *)&e,(string *)&local_1f0);
      uVar9 = std::__cxx11::string::~string((string *)&local_1f0);
      local_218 = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&absoluteContent,(value_type *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  if ((local_218 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_1d0,local_210);
    goto LAB_00395a42;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  this_00 = local_1d0;
  pTVar2 = local_200;
  __x = &absoluteContent;
  if (local_1f4 != Yes) goto switchD_00395908_caseD_2;
  PVar5 = cmMakefile::GetPolicyStatus
                    ((local_200->super_cmTargetPropCommandBase).Makefile,CMP0076,false);
  switch(PVar5) {
  case OLD:
switchD_00395908_caseD_0:
    __x = local_210;
  case NEW:
switchD_00395908_caseD_2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00,__x);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_00395a42:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&absoluteContent);
    return this_00;
  case WARN:
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x4c,id);
    poVar10 = std::operator<<((ostream *)&e,(string *)&local_1f0);
    std::operator<<(poVar10,"\n");
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    pcVar8 = (pTVar2->super_cmTargetPropCommandBase).Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1f0,(cmPolicies *)0x4c,id);
    cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_1f0);
    break;
  default:
    goto switchD_00395908_default;
  }
  std::__cxx11::string::~string((string *)&local_1f0);
switchD_00395908_default:
  if (local_214 == Yes) {
    poVar10 = std::operator<<((ostream *)&e,"An interface source of target \"");
    psVar7 = cmTarget::GetName_abi_cxx11_(local_208);
  }
  else {
    poVar10 = std::operator<<((ostream *)&e,
                              "A private source from a directory other than that of target \"");
    psVar7 = cmTarget::GetName_abi_cxx11_(local_208);
  }
  poVar10 = std::operator<<(poVar10,(string *)psVar7);
  std::operator<<(poVar10,"\" has a relative path.");
  pcVar8 = (pTVar2->super_cmTargetPropCommandBase).Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(pcVar8,AUTHOR_WARNING,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  goto switchD_00395908_caseD_0;
}

Assistant:

std::vector<std::string> TargetSourcesImpl::ConvertToAbsoluteContent(
  cmTarget* tgt, const std::vector<std::string>& content,
  IsInterface isInterfaceContent, CheckCMP0076 checkCmp0076)
{
  // Skip conversion in case old behavior has been explicitly requested
  if (checkCmp0076 == CheckCMP0076::Yes &&
      this->Makefile->GetPolicyStatus(cmPolicies::CMP0076) ==
        cmPolicies::OLD) {
    return content;
  }

  bool changedPath = false;
  std::vector<std::string> absoluteContent;
  absoluteContent.reserve(content.size());
  for (std::string const& src : content) {
    std::string absoluteSrc;
    if (cmSystemTools::FileIsFullPath(src) ||
        cmGeneratorExpression::Find(src) == 0 ||
        (isInterfaceContent == IsInterface::No &&
         (this->Makefile->GetCurrentSourceDirectory() ==
          tgt->GetMakefile()->GetCurrentSourceDirectory()))) {
      absoluteSrc = src;
    } else {
      changedPath = true;
      absoluteSrc =
        cmStrCat(this->Makefile->GetCurrentSourceDirectory(), '/', src);
    }
    absoluteContent.push_back(absoluteSrc);
  }

  if (!changedPath) {
    return content;
  }

  bool issueMessage = true;
  bool useAbsoluteContent = false;
  std::ostringstream e;
  if (checkCmp0076 == CheckCMP0076::Yes) {
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0076)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0076) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0076));
        break;
      case cmPolicies::NEW: {
        issueMessage = false;
        useAbsoluteContent = true;
        break;
      }
    }
  } else {
    issueMessage = false;
    useAbsoluteContent = true;
  }

  if (issueMessage) {
    if (isInterfaceContent == IsInterface::Yes) {
      e << "An interface source of target \"" << tgt->GetName()
        << "\" has a relative path.";
    } else {
      e << "A private source from a directory other than that of target \""
        << tgt->GetName() << "\" has a relative path.";
    }
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
  }

  return useAbsoluteContent ? absoluteContent : content;
}